

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
 __thiscall
Enhedron::Test::Impl::Impl_Suite::
context<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>
          (Impl_Suite *this,string *name,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_1,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_2,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_3,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_4,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_5,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_6,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_7,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_8,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_9,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_10,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_11,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_12)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Out<std::vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>_>
  local_80;
  undefined1 local_78 [8];
  ContextList contextList;
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  *childContextList_local_3;
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  *childContextList_local_2;
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  *childContextList_local_1;
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  *childContextList_local;
  string *name_local;
  
  contextList.
  super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = childContextList_3;
  std::
  vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ::vector((vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
            *)local_78);
  local_80 = Enhedron::Impl::Util::
             out<std::vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>>>
                       ((vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
                         *)local_78);
  std::
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  ::unique_ptr((unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
                *)&local_a0._M_string_length,childContextList);
  makeContextList<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>
            (local_80,(unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
                       *)&local_a0._M_string_length,childContextList_1,childContextList_2,
             contextList.
             super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,childContextList_4,
             childContextList_5,childContextList_6,childContextList_7,childContextList_8,
             childContextList_9,childContextList_10,childContextList_11,childContextList_12);
  std::
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  ::~unique_ptr((unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
                 *)&local_a0._M_string_length);
  ::std::
  make_unique<Enhedron::Test::Impl::Impl_Suite::NodeContext,std::__cxx11::string_const&,std::vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>>>
            (&local_a0,
             (vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
              *)name);
  ::std::
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>
  ::
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::NodeContext,std::default_delete<Enhedron::Test::Impl::Impl_Suite::NodeContext>,void>
            ((unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>
              *)this,(unique_ptr<Enhedron::Test::Impl::Impl_Suite::NodeContext,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::NodeContext>_>
                      *)&local_a0);
  std::
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::NodeContext,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::NodeContext>_>
  ::~unique_ptr((unique_ptr<Enhedron::Test::Impl::Impl_Suite::NodeContext,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::NodeContext>_>
                 *)&local_a0);
  std::
  vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ::~vector((vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
             *)local_78);
  return (__uniq_ptr_data<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>,_true,_true>
          )(__uniq_ptr_data<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>,_true,_true>
            )this;
}

Assistant:

unique_ptr<Context> context(const string& name, ContextListType&&... childContextList) {
        ContextList contextList;
        makeContextList(out(contextList), forward<ContextListType>(childContextList)...);

        return make_unique<NodeContext>(name, move(contextList));
    }